

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

QByteArray * __thiscall QHttpHeaders::combinedValue(QHttpHeaders *this,QAnyStringView name)

{
  long lVar1;
  QAnyStringView name_00;
  bool bVar2;
  size_t in_RCX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDX;
  HeaderName *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *result;
  HeaderName *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffa0;
  uint3 in_stack_ffffffffffffffa4;
  uint uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)in_stack_ffffffffffffffa4;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x1c81c1);
  bVar2 = isEmpty((QHttpHeaders *)0x1c81cb);
  if (!bVar2) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c81ea);
    name_00.m_size = in_RCX;
    name_00.field_0.m_data = in_RDX.m_data;
    HeaderName::HeaderName(in_stack_ffffffffffffff78,name_00);
    QHttpHeadersPrivate::combinedValue
              ((QHttpHeadersPrivate *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_RSI,in_RDI);
    HeaderName::~HeaderName((HeaderName *)0x1c8235);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpHeaders::combinedValue(QAnyStringView name) const
{
    QByteArray result;
    if (isEmpty())
        return result;

    d->combinedValue(HeaderName{name}, result);
    return result;
}